

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float64_to_float128_mips(float64 a,float_status *status)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  commonNaNT a_00;
  float64 a_01;
  ulong uVar4;
  uint uVar5;
  float128 fVar6;
  commonNaNT local_28;
  
  a_01 = float64_squash_input_denormal_mips(a,status);
  uVar4 = a_01 & 0xfffffffffffff;
  uVar5 = (uint)(a_01 >> 0x34) & 0x7ff;
  if (uVar5 == 0) {
    if (uVar4 == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = a_01 & 0x8000000000000000;
      return (float128)(auVar3 << 0x40);
    }
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar5 = ((uint)lVar1 ^ 0x3f) + 0xf5;
    uVar4 = uVar4 << ((byte)uVar5 & 0x3f);
    uVar5 = -(uVar5 & 0xff);
  }
  else if (uVar5 == 0x7ff) {
    if (uVar4 != 0) {
      float64ToCommonNaN(&local_28,a_01,status);
      a_00.high = local_28.high;
      a_00.sign = local_28.sign;
      a_00._1_7_ = local_28._1_7_;
      a_00.low = local_28.low;
      fVar6 = commonNaNToFloat128(a_00,status);
      return fVar6;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a_01 | 0x7fff000000000000;
    return (float128)(auVar2 << 0x40);
  }
  fVar6.high = (uVar4 >> 4 | a_01 & 0x8000000000000000) + ((ulong)(uVar5 + 0x3c00) << 0x30);
  fVar6.low = uVar4 << 0x3c;
  return fVar6;
}

Assistant:

float128 float64_to_float128(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloat128(float64ToCommonNaN(a, status), status);
        }
        return packFloat128( aSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat128( aSign, 0, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
        --aExp;
    }
    shift128Right( aSig, 0, 4, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp + 0x3C00, zSig0, zSig1 );

}